

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O0

void __thiscall CMU462::Timeline::draw(Timeline *this)

{
  bool bVar1;
  int iVar2;
  iterator this_00;
  reference piVar3;
  Timeline *in_RDI;
  double x;
  Timeline *unaff_retaddr;
  double current_x;
  double t_x;
  iterator iter;
  double line_w;
  double size;
  double b_y;
  double b_x;
  int i;
  double border_size;
  double button_start_x;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  _Rb_tree_const_iterator<int> *in_stack_ffffffffffffff98;
  _Self in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  _Self in_stack_ffffffffffffffb0;
  _Self local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  undefined4 in_stack_ffffffffffffffe0;
  double y;
  Timeline *pTVar4;
  
  pTVar4 = in_RDI;
  glColor4f();
  drawRectangle((Timeline *)in_stack_ffffffffffffffb0._M_node,in_stack_ffffffffffffffa8,
                (double)in_stack_ffffffffffffffa0._M_node,(double)in_stack_ffffffffffffff98,
                (double)in_RDI);
  iVar2 = getButtonStartX(in_RDI);
  x = (double)iVar2;
  y = 2.0;
  for (iVar2 = 0; iVar2 < 6; iVar2 = iVar2 + 1) {
    local_28 = x + (double)(iVar2 * in_RDI->h) + y;
    local_30 = (double)in_RDI->y + y;
    local_38 = -y + -y + (double)in_RDI->h;
    glColor4f();
    drawRectangle((Timeline *)in_stack_ffffffffffffffb0._M_node,in_stack_ffffffffffffffa8,
                  (double)in_stack_ffffffffffffffa0._M_node,(double)in_stack_ffffffffffffff98,
                  (double)in_RDI);
    if ((iVar2 == 5) && ((in_RDI->isLooping & 1U) != 0)) {
      glColor4f();
    }
    else if (in_RDI->selected_button_index == iVar2) {
      glColor4f();
    }
    else if (in_RDI->hover_button_index == iVar2) {
      glColor4f();
    }
    else {
      glColor4f();
    }
    drawButton(unaff_retaddr,(int)((ulong)pTVar4 >> 0x20),x,y,
               (double)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
  }
  glColor4f();
  glColor4f();
  local_40 = x - (double)in_RDI->x;
  local_48._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
  while( true ) {
    this_00 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(&local_48,(_Self *)&stack0xffffffffffffffb0);
    if (!bVar1) break;
    in_stack_ffffffffffffff88 = (set<int,_std::less<int>,_std::allocator<int>_> *)(double)in_RDI->x;
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)in_RDI);
    in_stack_ffffffffffffffa8 =
         (((double)*piVar3 * 1.0) / (double)in_RDI->max_frame) * local_40 +
         (double)in_stack_ffffffffffffff88;
    drawRectangle((Timeline *)this_00._M_node,in_stack_ffffffffffffffa8,
                  (double)in_stack_ffffffffffffffa0._M_node,(double)in_stack_ffffffffffffff98,
                  (double)in_RDI);
    in_stack_ffffffffffffffa0 =
         std::_Rb_tree_const_iterator<int>::operator++
                   (in_stack_ffffffffffffff98,(int)((ulong)in_RDI >> 0x20));
  }
  glColor4f();
  drawRectangle((Timeline *)this_00._M_node,in_stack_ffffffffffffffa8,
                (double)in_stack_ffffffffffffffa0._M_node,
                (((double)in_RDI->current_frame * 1.0) / (double)in_RDI->max_frame) * local_40 +
                (double)in_RDI->x,(double)in_RDI);
  return;
}

Assistant:

void Timeline::draw() {
  // -- White with opacity .8;
  glColor4f(1.0, 1.0, 1.0, 0.8);

  drawRectangle(x, y, x + w, y + h);

  double button_start_x = getButtonStartX();
  double border_size = 2;

  for (int i = 0; i < 6; i++) {
    // Draw each button.
    // Draw a button highlighted if hover_button_index == i.
    double b_x = button_start_x + i * h + border_size;
    double b_y = y + border_size;
    double size = h - border_size * 2;

    // Backgrounds for each button.
    // Black with opacity .3
    glColor4f(0.0, 0.0, 0.0, 0.3);
    drawRectangle(b_x, b_y, b_x + size, b_y + size);

    // Boolean button is enabled.
    if (i == LOOP && isLooping) {
      glColor4f(0.0, 0.0, 1.0, 1.0);
    }
    else if (selected_button_index == i) {
      glColor4f(0.0, 0.0, 1.0, 1.0);
    }
    else if (hover_button_index == i) {
      glColor4f(1.0, 0.0, 0.0, 1.0);
    }
    // Default, no hover, not enabled.
    else {
      // Faded red.
      glColor4f(0.3, 0.0, 0.0, 0.8);
    }

    drawButton(i, b_x, b_y, size);
  }

  // -- Draw the timeline with its various key frame locations.

  // First draw the timeline background.
  // Black with opacity .3
  glColor4f(0.0, 0.0, 0.0, 0.3);

  // Key frame time indicator color, (BLUE).
  glColor4f(0.0, 0.0, 1.0, .7);

  double line_w = button_start_x - x;

  for (set<int>::iterator iter = times.begin(); iter != times.end(); iter++) {
    // Draw a rectangle at x + (*iter)/max_frame * w to indicate keyframe times
    double t_x = x + (*iter) * 1.0 / max_frame * line_w;
    drawRectangle(t_x, y + border_size * 2, t_x + 1, y + h - border_size * 2);
  }

  glColor4f(1.0, 0.0, 0.0, 1.0);

  double current_x = x + current_frame * 1.0 / max_frame * line_w;
  drawRectangle(current_x - 2, y + border_size, current_x, y + h - border_size);
}